

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

bool __thiscall
ICM::Compiler::InstructionCreater::createNodeWhile
          (InstructionCreater *this,Node *node,Element *refelt)

{
  InstructionList *this_00;
  pointer *pppIVar1;
  size_t *psVar2;
  pointer pEVar3;
  pointer ppIVar4;
  pointer ppIVar5;
  iterator iVar6;
  pointer ppuVar7;
  pointer ppuVar8;
  InstructionData *pIVar9;
  uint_t uVar10;
  pointer ppuVar11;
  InstructionData *local_48;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *local_40;
  Element *local_38;
  
  local_40 = &this->LoopBreakIDs;
  local_48 = (InstructionData *)node->index;
  psVar2 = (this->LoopBreakIDs).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_38 = refelt;
  if (psVar2 == (this->LoopBreakIDs).c.
                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::_M_push_back_aux<unsigned_long>
              (&local_40->c,(unsigned_long *)&local_48);
  }
  else {
    *psVar2 = (size_t)local_48;
    (this->LoopBreakIDs).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur = psVar2 + 1;
  }
  pEVar3 = (node->super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
           super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>._M_impl
           .super__Vector_impl_data._M_start;
  this_00 = &this->InstList;
  ppIVar4 = (this->InstList).
            super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
            .
            super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppIVar5 = (this->InstList).
            super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
            .
            super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  createReferNode(this,pEVar3 + 1);
  pIVar9 = (InstructionData *)operator_new(0x28);
  pIVar9->_vptr_InstructionData = (_func_int **)0x0;
  *(undefined8 *)&pIVar9->Inst = 0;
  pIVar9[1]._vptr_InstructionData = (_func_int **)0x0;
  *(undefined8 *)&pIVar9[1].Inst = 0;
  pIVar9[2]._vptr_InstructionData = (_func_int **)0x0;
  pIVar9->Inst = jmpn;
  pIVar9->_vptr_InstructionData = (_func_int **)&PTR_getToString_abi_cxx11__00151e48;
  *(undefined4 *)&pIVar9[1]._vptr_InstructionData = 0;
  *(undefined8 *)&pIVar9[1].Inst = 0;
  uVar10 = pEVar3[1].index;
  *(anon_union_4_2_4727c1b0_for_Element_0 *)&pIVar9[1]._vptr_InstructionData = pEVar3[1].field_0;
  *(uint_t *)&pIVar9[1].Inst = uVar10;
  iVar6._M_current =
       (this->InstList).
       super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
       .
       super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48 = pIVar9;
  if (iVar6._M_current ==
      (this->InstList).
      super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
      .
      super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<ICM::Instruction::InstructionData*,std::allocator<ICM::Instruction::InstructionData*>>::
    _M_realloc_insert<ICM::Instruction::InstructionData*>
              ((vector<ICM::Instruction::InstructionData*,std::allocator<ICM::Instruction::InstructionData*>>
                *)this_00,iVar6,&local_48);
  }
  else {
    *iVar6._M_current = pIVar9;
    pppIVar1 = &(this->InstList).
                super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                .
                super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  createReferNode(this,pEVar3 + 2);
  local_48 = (InstructionData *)operator_new(0x18);
  local_48->_vptr_InstructionData = (_func_int **)0x0;
  *(undefined8 *)&local_48->Inst = 0;
  local_48->Inst = jump;
  local_48->_vptr_InstructionData = (_func_int **)&PTR_getToString_abi_cxx11__00151e00;
  local_48[1]._vptr_InstructionData = (_func_int **)((long)ppIVar4 - (long)ppIVar5 >> 3);
  iVar6._M_current =
       (this->InstList).
       super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
       .
       super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar6._M_current ==
      (this->InstList).
      super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
      .
      super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<ICM::Instruction::InstructionData*,std::allocator<ICM::Instruction::InstructionData*>>::
    _M_realloc_insert<ICM::Instruction::InstructionData*>
              ((vector<ICM::Instruction::InstructionData*,std::allocator<ICM::Instruction::InstructionData*>>
                *)this_00,iVar6,&local_48);
  }
  else {
    *iVar6._M_current = local_48;
    pppIVar1 = &(this->InstList).
                super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                .
                super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  pIVar9[2]._vptr_InstructionData =
       (_func_int **)
       ((long)(this->InstList).
              super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
              .
              super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->InstList).
              super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
              .
              super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3);
  Instruction::InstructionList::push(this_00,nop);
  if ((local_38->field_0).field_0.etype != '\x02') {
    __assert_fail("isRefer()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Chill-Language[P]ICM/include/parser/ast.h"
                  ,0x34,"void ICM::ASTBase::Element::setRefer(size_t)");
  }
  uVar10 = ((long)(this->InstList).
                  super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                  .
                  super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->InstList).
                  super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                  .
                  super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) - 1;
  local_38->index = uVar10;
  ppuVar7 = (this->LoopBreakJumpPtrs).
            super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppuVar8 = (this->LoopBreakJumpPtrs).
            super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppuVar11 = ppuVar7;
  if (ppuVar7 != ppuVar8) {
    do {
      **ppuVar11 = uVar10;
      ppuVar11 = ppuVar11 + 1;
    } while (ppuVar11 != ppuVar8);
    if (ppuVar7 != ppuVar8) {
      (this->LoopBreakJumpPtrs).
      super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppuVar7;
    }
  }
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&local_40->c);
  return true;
}

Assistant:

bool createNodeWhile(Node &node, Element &refelt) {
				LoopBreakIDs.push(node.getIndex());
				Element &Bexp = node[1];
				Element &Rdo = node[2];
				size_t Bid = NextInstID();
				createReferNode(Bexp);
				auto *jpendinst = new Insts::JumpNot();
				jpendinst->Data = ConvertToInstElement(Bexp);
				InstList.push_back(jpendinst);
				createReferNode(Rdo);
				Insts::Jump *jmp = new Insts::Jump();
				jmp->Index = Bid;
				InstList.push_back(jmp);
				jpendinst->Index = NextInstID();
				InstList.push(nop);

				refelt.setRefer(CurrInstID());
				adjustLoopBreakJump(refelt.getRefer());
				LoopBreakIDs.pop();
				return true;
			}